

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

void do_poison_dust(CHAR_DATA *ch,char *argument)

{
  CHAR_DATA *pCVar1;
  bool bVar2;
  int iVar3;
  CClass *this;
  char *pcVar4;
  CHAR_DATA *in_RDI;
  float fVar5;
  char buf [4608];
  bool fighting;
  float chance;
  AFFECT_DATA af;
  CHAR_DATA *vch_next;
  CHAR_DATA *vch;
  CHAR_DATA *in_stack_ffffffffffffed48;
  CHAR_DATA *in_stack_ffffffffffffed50;
  CHAR_DATA *pCVar6;
  CHAR_DATA *in_stack_ffffffffffffed58;
  undefined4 in_stack_ffffffffffffed60;
  int in_stack_ffffffffffffed64;
  int in_stack_ffffffffffffed84;
  CHAR_DATA *in_stack_ffffffffffffed88;
  int in_stack_ffffffffffffed90;
  int in_stack_ffffffffffffee24;
  undefined1 in_stack_ffffffffffffee2b;
  int in_stack_ffffffffffffee2c;
  GEN_DATA *in_stack_ffffffffffffee30;
  int in_stack_ffffffffffffee4c;
  CHAR_DATA *in_stack_ffffffffffffee50;
  CHAR_DATA *local_18;
  
  iVar3 = get_skill(in_stack_ffffffffffffee50,in_stack_ffffffffffffee4c);
  fVar5 = (float)iVar3;
  if ((fVar5 != 0.0) || (NAN(fVar5))) {
    in_stack_ffffffffffffed64 = (int)in_RDI->level;
    in_stack_ffffffffffffed58 = (CHAR_DATA *)(skill_table + gsn_poison_dust);
    this = char_data::Class((char_data *)
                            CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60));
    iVar3 = CClass::GetIndex(this);
    if (*(short *)((long)&in_stack_ffffffffffffed58->next_in_room + (long)iVar3 * 2) <=
        in_stack_ffffffffffffed64) {
      if (in_RDI->mana < 0x14) {
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60),
                     in_stack_ffffffffffffed58);
        return;
      }
      iVar3 = number_percent();
      if (fVar5 < (float)iVar3) {
        act((char *)CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60),
            in_stack_ffffffffffffed58,in_stack_ffffffffffffed50,in_stack_ffffffffffffed48,0);
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60),
                     in_stack_ffffffffffffed58);
        in_RDI->mana = in_RDI->mana + -10;
        WAIT_STATE((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60),
                   (int)((ulong)in_stack_ffffffffffffed58 >> 0x20));
        check_improve((CHAR_DATA *)in_stack_ffffffffffffee30,in_stack_ffffffffffffee2c,
                      (bool)in_stack_ffffffffffffee2b,in_stack_ffffffffffffee24);
        return;
      }
      act((char *)CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60),
          in_stack_ffffffffffffed58,in_stack_ffffffffffffed50,in_stack_ffffffffffffed48,0);
      send_to_char((char *)CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60),
                   in_stack_ffffffffffffed58);
      check_improve((CHAR_DATA *)in_stack_ffffffffffffee30,in_stack_ffffffffffffee2c,
                    (bool)in_stack_ffffffffffffee2b,in_stack_ffffffffffffee24);
      pCVar6 = in_RDI->fighting;
      init_affect((AFFECT_DATA *)0x5ec014);
      std::pow<int,int>(0,0x5ec080);
      in_RDI->mana = in_RDI->mana + -0x14;
      WAIT_STATE((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60),
                 (int)((ulong)in_stack_ffffffffffffed58 >> 0x20));
      pCVar1 = in_RDI->in_room->people;
      do {
        local_18 = pCVar1;
        if (local_18 == (CHAR_DATA *)0x0) {
          return;
        }
        pCVar1 = local_18->next_in_room;
        bVar2 = is_safe(in_stack_ffffffffffffed50,in_stack_ffffffffffffed48);
      } while (((bVar2) || (bVar2 = is_immortal(in_stack_ffffffffffffed48), bVar2)) ||
              (bVar2 = is_same_group(in_RDI,local_18), bVar2));
      bVar2 = is_affected_by(in_stack_ffffffffffffed58,
                             (int)((ulong)in_stack_ffffffffffffed50 >> 0x20));
      if ((!bVar2) &&
         (bVar2 = saves_spell(in_stack_ffffffffffffed90,in_stack_ffffffffffffed88,
                              in_stack_ffffffffffffed84), !bVar2)) {
        act((char *)CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60),
            in_stack_ffffffffffffed58,in_stack_ffffffffffffed50,in_stack_ffffffffffffed48,0);
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60),
                     in_stack_ffffffffffffed58);
        affect_to_char(in_stack_ffffffffffffed50,(AFFECT_DATA *)in_stack_ffffffffffffed48);
      }
      bVar2 = is_npc(in_stack_ffffffffffffed48);
      if (bVar2) {
        return;
      }
      bVar2 = is_npc(in_stack_ffffffffffffed48);
      if (bVar2) {
        return;
      }
      if ((local_18->fighting != (CHAR_DATA *)0x0) && (pCVar6 != (CHAR_DATA *)0x0)) {
        return;
      }
      pCVar6 = (CHAR_DATA *)&stack0xffffffffffffed68;
      pcVar4 = pers(in_stack_ffffffffffffed58,pCVar6);
      sprintf((char *)pCVar6,"Help! %s just threw dust in my eyes!",pcVar4);
      do_myell((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60),
               (char *)in_stack_ffffffffffffed58,pCVar6);
      return;
    }
  }
  send_to_char((char *)CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60),
               in_stack_ffffffffffffed58);
  return;
}

Assistant:

void do_poison_dust(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *vch;
	CHAR_DATA *vch_next;
	AFFECT_DATA af;
	float chance;
	bool fighting = false;
	char buf[MAX_STRING_LENGTH];

	chance = get_skill(ch, gsn_poison_dust);

	if (chance == 0
		|| ch->level < skill_table[gsn_poison_dust].skill_level[ch->Class()->GetIndex()])
	{
		send_to_char("You don't know how to make poison dust to throw.\n\r", ch);
		return;
	}

	if (ch->mana < 20)
	{
		send_to_char("You don't have the mana.\n\r", ch);
		return;
	}

	if (number_percent() > chance)
	{
		act("$n hurls some dust into the air but it is blown away.", ch, 0, 0, TO_ROOM);
		send_to_char("You throw out some dust but it is blown away.\n\r", ch);
		ch->mana -= 10;

		WAIT_STATE(ch, 12);
		check_improve(ch, gsn_poison_dust, false, 2);
		return;
	}

	act("$n hurls a handful of dust into the room!", ch, 0, 0, TO_ROOM);
	send_to_char("You throw a handful of poison dust into the room!\n\r", ch);
	check_improve(ch, gsn_poison_dust, true, 2);

	if (ch->fighting != nullptr)
		fighting = true;

	af.aftype = AFT_SKILL;
	init_affect(&af);

	af.where = TO_AFFECTS;
	af.type = gsn_poison;
	af.aftype = AFT_MALADY;
	af.level = ch->level;
	af.duration = ch->level / 5;

	SET_BIT(af.bitvector, AFF_POISON);

	af.location = APPLY_STR;
	af.modifier = -5;
	af.tick_fun = poison_tick;
	ch->mana -= 20;

	WAIT_STATE(ch, 12);

	for (vch = ch->in_room->people; vch != nullptr; vch = vch_next)
	{
		vch_next = vch->next_in_room;

		if (is_safe(ch, vch) || is_immortal(vch))
			continue;

		if (is_same_group(ch, vch))
			continue;

		if (!is_affected_by(vch, AFF_POISON) && !saves_spell(ch->level, vch, DAM_POISON))
		{
			act("$n turns green and looks sick.", vch, 0, 0, TO_ROOM);
			send_to_char("You suddenly feel very sick.\n\r", vch);
			affect_to_char(vch, &af);
		}

		if (!is_npc(vch) && !is_npc(ch) && (vch->fighting == nullptr || (!fighting)))
		{
			sprintf(buf, "Help! %s just threw dust in my eyes!", pers(ch, vch));
			do_myell(vch, buf, ch);
		}
	return;

		if (vch->fighting == nullptr)
			multi_hit(vch, ch, TYPE_UNDEFINED);
	}
}